

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPipeConnection.cxx
# Opt level: O0

void __thiscall cmPipeConnection::Connect(cmPipeConnection *this,uv_stream_t *server)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  int iVar2;
  uv_stream_s *puVar3;
  uv_loop_t *puVar4;
  uv_stream_t *puVar5;
  uv_handle_ptr_<uv_stream_s> local_60;
  uint local_4c;
  undefined1 local_48 [8];
  uv_pipe_ptr ClientPipe;
  undefined1 local_28 [8];
  uv_pipe_ptr rejectPipe;
  uv_stream_t *server_local;
  cmPipeConnection *this_local;
  
  rejectPipe.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle.
  super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)server;
  puVar3 = ::cm::uv_handle_ptr_base_<uv_stream_s>::get
                     (&(this->super_cmEventBasedConnection).WriteStream.
                       super_uv_handle_ptr_base_<uv_stream_s>);
  if (puVar3 == (uv_stream_s *)0x0) {
    ::cm::uv_pipe_ptr::uv_pipe_ptr((uv_pipe_ptr *)local_48);
    puVar4 = cmServerBase::GetLoop((this->super_cmEventBasedConnection).super_cmConnection.Server);
    ::cm::uv_pipe_ptr::init((uv_pipe_ptr *)local_48,(EVP_PKEY_CTX *)puVar4);
    _Var1 = rejectPipe.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle.
            super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    puVar5 = ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_((uv_pipe_ptr *)local_48);
    iVar2 = uv_accept((uv_stream_t *)_Var1._M_pi,puVar5);
    if (iVar2 == 0) {
      puVar5 = ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_((uv_pipe_ptr *)local_48);
      uv_read_start(puVar5,cmEventBasedConnection::on_alloc_buffer,cmEventBasedConnection::on_read);
      ::cm::uv_handle_ptr_<uv_stream_s>::uv_handle_ptr_base_<cm::uv_pipe_ptr,void>
                (&local_60,(uv_pipe_ptr *)local_48);
      ::cm::uv_handle_ptr_<uv_stream_s>::operator=
                (&(this->super_cmEventBasedConnection).WriteStream,&local_60);
      ::cm::uv_handle_ptr_<uv_stream_s>::~uv_handle_ptr_(&local_60);
      (*((this->super_cmEventBasedConnection).super_cmConnection.Server)->_vptr_cmServerBase[4])();
    }
    local_4c = (uint)(iVar2 != 0);
    ::cm::uv_pipe_ptr::~uv_pipe_ptr((uv_pipe_ptr *)local_48);
  }
  else {
    ::cm::uv_pipe_ptr::uv_pipe_ptr((uv_pipe_ptr *)local_28);
    puVar4 = cmServerBase::GetLoop((this->super_cmEventBasedConnection).super_cmConnection.Server);
    ::cm::uv_pipe_ptr::init((uv_pipe_ptr *)local_28,(EVP_PKEY_CTX *)puVar4);
    _Var1 = rejectPipe.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle.
            super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    puVar5 = ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_((uv_pipe_ptr *)local_28);
    uv_accept((uv_stream_t *)_Var1._M_pi,puVar5);
    ::cm::uv_pipe_ptr::~uv_pipe_ptr((uv_pipe_ptr *)local_28);
  }
  return;
}

Assistant:

void cmPipeConnection::Connect(uv_stream_t* server)
{
  if (this->WriteStream.get()) {
    // Accept and close all pipes but the first:
    cm::uv_pipe_ptr rejectPipe;

    rejectPipe.init(*this->Server->GetLoop(), 0);
    uv_accept(server, rejectPipe);

    return;
  }

  cm::uv_pipe_ptr ClientPipe;
  ClientPipe.init(*this->Server->GetLoop(), 0,
                  static_cast<cmEventBasedConnection*>(this));

  if (uv_accept(server, ClientPipe) != 0) {
    return;
  }

  uv_read_start(ClientPipe, on_alloc_buffer, on_read);
  WriteStream = std::move(ClientPipe);
  Server->OnConnected(this);
}